

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O2

size_t dlmalloc_set_footprint_limit(size_t bytes)

{
  if (bytes == 0xffffffffffffffff) {
    _gm_.footprint_limit = 0;
  }
  else {
    _gm_.footprint_limit = -mparams.granularity & (bytes + mparams.granularity) - 1;
  }
  return _gm_.footprint_limit;
}

Assistant:

size_t dlmalloc_set_footprint_limit(size_t bytes) {
  size_t result;  /* invert sense of 0 */
  if (bytes == 0)
    result = granularity_align(1); /* Use minimal size */
  if (bytes == MAX_SIZE_T)
    result = 0;                    /* disable */
  else
    result = granularity_align(bytes);
  return gm->footprint_limit = result;
}